

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result * __thiscall
testing::Action<ot::commissioner::Error_(ot::commissioner::SecurityPolicy_&)>::Perform
          (Result *__return_storage_ptr__,
          Action<ot::commissioner::Error_(ot::commissioner::SecurityPolicy_&)> *this,
          ArgumentTuple *args)

{
  bool bVar1;
  tuple<ot::commissioner::SecurityPolicy_&> *in_RCX;
  ArgumentTuple *args_local;
  Action<ot::commissioner::Error_(ot::commissioner::SecurityPolicy_&)> *this_local;
  
  bVar1 = IsDoDefault(this);
  if (bVar1) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  internal::
  Apply<std::function<ot::commissioner::Error(ot::commissioner::SecurityPolicy&)>const&,std::tuple<ot::commissioner::SecurityPolicy&>>
            (__return_storage_ptr__,(internal *)this,
             (function<ot::commissioner::Error_(ot::commissioner::SecurityPolicy_&)> *)args,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }